

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O0

Color __thiscall RoughConductorBRDF::f(RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi)

{
  vec3f wm_00;
  vec3f wi_00;
  vec3f wo_00;
  vec3f *in_RDX;
  undefined8 extraout_XMM0_Qb;
  vec3f vVar1;
  Color CVar2;
  Color Fres;
  Color r2;
  Color t2;
  Color r1;
  Color t1;
  float cos;
  vec3f wm;
  vec3f *in_stack_fffffffffffffa80;
  vec3f *this_00;
  undefined1 in_stack_fffffffffffffa88 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffaa0;
  float fVar5;
  float alpha;
  undefined8 in_stack_fffffffffffffb08;
  float fVar6;
  undefined4 in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  float in_stack_fffffffffffffb50;
  undefined8 local_3d0;
  float local_3c8;
  undefined8 local_3c0;
  float local_3b8;
  vec3f local_3ac;
  vec3f local_3a0;
  vec3f local_390;
  vec3f local_380;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  vec3f local_31c;
  vec3f local_310;
  vec3f local_300;
  vec3f local_2f0;
  undefined8 local_2e0;
  float local_2d8;
  undefined8 local_2d0;
  float local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_290;
  float local_288;
  vec3f local_280;
  undefined8 local_270;
  float local_268;
  vec3f local_260;
  undefined8 local_250;
  float local_248;
  undefined8 local_240;
  float local_238;
  vec3f local_230;
  vec3f local_220;
  vec3f local_20c;
  undefined8 local_200;
  float local_1f8;
  vec3f local_1f0;
  vec3f local_1e0;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  vec3f local_17c;
  vec3f local_170;
  vec3f local_160;
  vec3f local_150;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  vec3f local_f0;
  vec3f local_e0;
  vec3f local_d0;
  undefined8 local_c0;
  float local_b8;
  vec3f local_b0;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  float local_74;
  vec3f local_70;
  vec3f local_60;
  undefined8 local_50;
  float local_48;
  vec3f local_40 [2];
  vec3f *local_28;
  float fVar7;
  
  local_28 = in_RDX;
  vVar1 = ::operator+(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_60.z = vVar1.z;
  local_48 = local_60.z;
  local_60._0_8_ = vVar1._0_8_;
  local_50._0_4_ = local_60.x;
  local_50._4_4_ = local_60.y;
  local_60 = vVar1;
  vVar1 = normalized(in_stack_fffffffffffffa88._8_8_);
  local_70.z = vVar1.z;
  local_40[0].z = local_70.z;
  local_70._0_8_ = vVar1._0_8_;
  local_40[0].x = local_70.x;
  local_40[0].y = local_70.y;
  local_70 = vVar1;
  local_74 = dot(local_40,local_28);
  vVar1 = ::operator*(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_b0.z = vVar1.z;
  local_98 = local_b0.z;
  local_b0._0_8_ = vVar1._0_8_;
  local_a0._0_4_ = local_b0.x;
  local_a0._4_4_ = local_b0.y;
  local_b0 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_d0.z = vVar1.z;
  local_b8 = local_d0.z;
  local_d0._0_8_ = vVar1._0_8_;
  local_c0._0_4_ = local_d0.x;
  local_c0._4_4_ = local_d0.y;
  local_d0 = vVar1;
  vVar1 = ::operator+(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_e0.z = vVar1.z;
  local_88 = local_e0.z;
  local_e0._0_8_ = vVar1._0_8_;
  local_90._0_4_ = local_e0.x;
  local_90._4_4_ = local_e0.y;
  local_e0 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._4_4_);
  local_f0.z = vVar1.z;
  local_78 = local_f0.z;
  local_f0._0_8_ = vVar1._0_8_;
  local_80._0_4_ = local_f0.x;
  local_80._4_4_ = local_f0.y;
  alpha = 2.0;
  local_f0 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffa88._0_4_,in_stack_fffffffffffffa80);
  local_150.z = vVar1.z;
  local_138 = local_150.z;
  local_150._0_8_ = vVar1._0_8_;
  local_140._0_4_ = local_150.x;
  local_140._4_4_ = local_150.y;
  local_150 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._4_4_);
  local_160.z = vVar1.z;
  local_128 = local_160.z;
  local_160._0_8_ = vVar1._0_8_;
  local_130._0_4_ = local_160.x;
  local_130._4_4_ = local_160.y;
  uVar4 = (undefined4)((ulong)&local_80 >> 0x20);
  local_160 = vVar1;
  vVar1 = ::operator-(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_170.z = vVar1.z;
  local_118 = local_170.z;
  local_170._0_8_ = vVar1._0_8_;
  local_120._0_4_ = local_170.x;
  local_120._4_4_ = local_170.y;
  this_00 = &local_17c;
  fVar5 = 1.0;
  local_170 = vVar1;
  vec3f::vec3f(this_00,1.0);
  vVar1 = ::operator+(in_stack_fffffffffffffa88._8_8_,in_stack_fffffffffffffa88._0_8_);
  local_188 = vVar1.z;
  local_190 = vVar1._0_8_;
  auVar3._8_4_ = (int)extraout_XMM0_Qb;
  auVar3._0_8_ = local_190;
  auVar3._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_110 = local_190;
  local_108 = local_188;
  vVar1 = ::operator*(vVar1.x,this_00);
  local_1e0.z = vVar1.z;
  local_1c8 = local_1e0.z;
  local_1e0._0_8_ = vVar1._0_8_;
  local_1d0._0_4_ = local_1e0.x;
  local_1d0._4_4_ = local_1e0.y;
  local_1e0 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_1f0.z = vVar1.z;
  local_1b8 = local_1f0.z;
  local_1f0._0_8_ = vVar1._0_8_;
  local_1c0._0_4_ = local_1f0.x;
  local_1c0._4_4_ = local_1f0.y;
  local_1f0 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_1f8 = vVar1.z;
  local_200 = vVar1._0_8_;
  local_1b0 = local_200;
  local_1a8 = local_1f8;
  vec3f::vec3f(&local_20c,fVar5);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_220.z = vVar1.z;
  local_198 = local_220.z;
  local_220._0_8_ = vVar1._0_8_;
  local_1a0._0_4_ = local_220.x;
  local_1a0._4_4_ = local_220.y;
  local_220 = vVar1;
  vVar1 = operator/(auVar3._8_8_,auVar3._0_8_);
  local_230.z = vVar1.z;
  local_f8 = local_230.z;
  local_230._0_8_ = vVar1._0_8_;
  local_100._0_4_ = local_230.x;
  local_100._4_4_ = local_230.y;
  local_230 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  local_260.z = vVar1.z;
  local_248 = local_260.z;
  local_260._0_8_ = vVar1._0_8_;
  local_250._0_4_ = local_260.x;
  local_250._4_4_ = local_260.y;
  local_260 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  local_280.z = vVar1.z;
  local_268 = local_280.z;
  local_280._0_8_ = vVar1._0_8_;
  local_270._0_4_ = local_280.x;
  local_270._4_4_ = local_280.y;
  local_280 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_288 = vVar1.z;
  local_290 = vVar1._0_8_;
  local_240 = local_290;
  local_238 = local_288;
  vVar1 = ::operator*(auVar3._0_4_,this_00);
  local_2f0.z = vVar1.z;
  local_2d8 = local_2f0.z;
  local_2f0._0_8_ = vVar1._0_8_;
  local_2e0._0_4_ = local_2f0.x;
  local_2e0._4_4_ = local_2f0.y;
  local_2f0 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_300.z = vVar1.z;
  local_2c8 = local_300.z;
  local_300._0_8_ = vVar1._0_8_;
  local_2d0._0_4_ = local_300.x;
  local_2d0._4_4_ = local_300.y;
  fVar6 = SUB84(&local_240,0);
  local_300 = vVar1;
  vVar1 = ::operator-(auVar3._8_8_,auVar3._0_8_);
  local_310.z = vVar1.z;
  local_2b8 = local_310.z;
  local_310._0_8_ = vVar1._0_8_;
  local_2c0._0_4_ = local_310.x;
  local_2c0._4_4_ = local_310.y;
  local_310 = vVar1;
  vec3f::vec3f(&local_31c,local_74 * local_74);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_328 = vVar1.z;
  local_330 = vVar1._0_8_;
  local_2b0 = local_330;
  local_2a8 = local_328;
  vVar1 = ::operator*(auVar3._0_4_,this_00);
  local_380.z = vVar1.z;
  local_368 = local_380.z;
  local_380._0_8_ = vVar1._0_8_;
  local_370._0_4_ = local_380.x;
  local_370._4_4_ = local_380.y;
  local_380 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_390.z = vVar1.z;
  local_358 = local_390.z;
  local_390._0_8_ = vVar1._0_8_;
  local_360._0_4_ = local_390.x;
  local_360._4_4_ = local_390.y;
  local_390 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_3a0.z = vVar1.z;
  local_348 = local_3a0.z;
  local_3a0._0_8_ = vVar1._0_8_;
  local_350._0_4_ = local_3a0.x;
  local_350._4_4_ = local_3a0.y;
  local_3a0 = vVar1;
  vec3f::vec3f(&local_3ac,local_74 * local_74);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_3b8 = vVar1.z;
  local_338 = local_3b8;
  local_3c0 = vVar1._0_8_;
  local_340 = local_3c0;
  vVar1 = operator/(auVar3._8_8_,auVar3._0_8_);
  local_3c8 = vVar1.z;
  local_298 = local_3c8;
  local_3d0 = vVar1._0_8_;
  local_2a0 = local_3d0;
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._0_4_,this_00);
  vVar1.y = (float)in_stack_fffffffffffffaa0;
  vVar1.x = (float)uVar4;
  vVar1.z = fVar5;
  fVar5 = EDX::GGX_D(vVar1,auVar3._0_4_);
  wo_00.y = (float)in_stack_fffffffffffffb4c;
  wo_00.x = (float)in_stack_fffffffffffffb48;
  wo_00.z = in_stack_fffffffffffffb50;
  wi_00.y = fVar5;
  wi_00.x = (float)in_stack_fffffffffffffb28;
  wi_00.z = in_stack_fffffffffffffb30;
  wm_00.z = fVar6;
  wm_00.x = (float)(int)in_stack_fffffffffffffb08;
  wm_00.y = (float)(int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  EDX::Smith_G(wo_00,wi_00,wm_00,alpha);
  ::operator*(auVar3._0_4_,this_00);
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  CVar2.x = vVar1.x;
  CVar2.y = vVar1.y;
  register0x00001240 = vVar1.z;
  return CVar2;
}

Assistant:

Color f(const Color& albedo, const vec3f& wo, const vec3f& wi) const override
	{
		vec3f wm = normalized(wo+wi); // microfacet normal
		float cos = dot(wm,wo);
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		Color Fres = 0.5 * (r1 + r2); // reflected energy
		return EDX::GGX_D(wm,alpha) * EDX::Smith_G(wo,wi,wm,alpha) / (4 * wo.z * wi.z) * Fres * albedo;
	}